

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

string * __thiscall
pbrt::DielectricMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DielectricMaterial *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,bool_const&>
            (__return_storage_ptr__,
             "[ DielectricMaterial displacement: %s uRoughness: %s vRoughness: %s etaF: %s etaS: %s remapRoughness: %s ]"
             ,&this->displacement,&this->uRoughness,&this->vRoughness,&this->etaF,&this->etaS,
             &this->remapRoughness);
  return __return_storage_ptr__;
}

Assistant:

std::string DielectricMaterial::ToString() const {
    return StringPrintf("[ DielectricMaterial displacement: %s uRoughness: %s "
                        "vRoughness: %s etaF: %s "
                        "etaS: %s remapRoughness: %s ]",
                        displacement, uRoughness, vRoughness, etaF, etaS, remapRoughness);
}